

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_start_doc(Parser *this,bool as_child)

{
  undefined8 uVar1;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  bool bVar2;
  error_flags eVar3;
  Tree *this_00;
  NodeData *node;
  NodeData *pNVar4;
  size_t sVar5;
  Tree *pTVar6;
  byte in_SIL;
  long in_RDI;
  char msg_3 [77];
  Tree *in_stack_00000130;
  char msg_2 [43];
  char msg_1 [34];
  size_t parent_id;
  char msg [58];
  size_t child;
  State *in_stack_fffffffffffffc58;
  flag_t on;
  Parser *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  Location *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  Location *in_stack_fffffffffffffc80;
  code *in_stack_fffffffffffffca8;
  Tree *in_stack_fffffffffffffcb0;
  code *in_stack_fffffffffffffcc0;
  undefined1 *in_stack_fffffffffffffcc8;
  code *in_stack_fffffffffffffcd0;
  long in_stack_fffffffffffffcd8;
  size_t in_stack_fffffffffffffce0;
  size_t sVar7;
  code *in_stack_fffffffffffffcf0;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined1 local_2c8 [16];
  Tree *in_stack_fffffffffffffd48;
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  char *local_250;
  undefined1 local_248 [56];
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  char *local_1f0;
  undefined1 local_1e8 [24];
  Tree *in_stack_fffffffffffffe30;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  char *local_190;
  undefined1 local_188 [63];
  byte local_149;
  size_t local_140;
  undefined8 local_138;
  size_t local_130;
  undefined8 local_128;
  State *local_120;
  Parser *pPStack_118;
  char *local_110;
  Location *pLStack_108;
  char *local_100;
  Tree *local_f8;
  State *local_f0;
  Parser *pPStack_e8;
  char *local_e0;
  Location *pLStack_d8;
  char *local_d0;
  long local_c8;
  long local_c0;
  NodeData *local_b8;
  size_t local_b0;
  State *local_a8;
  Parser *pPStack_a0;
  State *local_80;
  Parser *pPStack_78;
  char *local_70;
  Location *pLStack_68;
  State *local_58;
  Parser *pPStack_50;
  char *local_48;
  Location *pLStack_40;
  size_t local_30;
  size_t local_28;
  undefined8 local_20;
  size_t local_18;
  undefined8 local_10;
  NodeData *local_8;
  
  local_149 = in_SIL & 1;
  this_00 = (Tree *)(in_RDI + 0x38);
  local_f8 = this_00;
  if (*(long *)(in_RDI + 0x9c0) == 0) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                       (size_t)in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58);
    loc.super_LineCol.line = (size_t)in_stack_fffffffffffffcc8;
    loc.super_LineCol.offset = (size_t)in_stack_fffffffffffffcc0;
    loc.super_LineCol.col = (size_t)in_stack_fffffffffffffcd0;
    loc.name.str = (char *)in_stack_fffffffffffffcd8;
    loc.name.len = in_stack_fffffffffffffce0;
    error<25ul>((char (*) [25])in_stack_fffffffffffffcb0,loc);
    in_stack_fffffffffffffc58 = local_120;
    in_stack_fffffffffffffc60 = pPStack_118;
    in_stack_fffffffffffffc68 = local_110;
    in_stack_fffffffffffffc70 = pLStack_108;
    in_stack_fffffffffffffc78 = local_100;
  }
  node = Parser::node(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  pNVar4 = Parser::node(in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58);
  if (node != pNVar4) {
    memcpy(local_188,"check failed: (node(m_stack.bottom()) == node(m_root_id))",0x3a);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffcf0 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                       (size_t)in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68,
                       (size_t)in_stack_fffffffffffffc60);
    in_stack_fffffffffffffc68 = (char *)CONCAT44(uStack_19c,local_1a0);
    in_stack_fffffffffffffc70 = (Location *)CONCAT44(uStack_194,uStack_198);
    in_stack_fffffffffffffc58 = (State *)CONCAT44(uStack_1ac,local_1b0);
    in_stack_fffffffffffffc60 = (Parser *)CONCAT44(uStack_1a4,uStack_1a8);
    (*in_stack_fffffffffffffcf0)(local_188,0x3a,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffc78 = local_190;
  }
  sVar5 = detail::stack<c4::yml::Parser::State,_16UL>::size
                    ((stack<c4::yml::Parser::State,_16UL> *)(in_RDI + 0x38));
  if (sVar5 < 2) {
    sVar5 = *(size_t *)(in_RDI + 0x28);
  }
  else {
    in_stack_fffffffffffffcd8 = in_RDI + 0x38;
    local_c8 = 1;
    local_c0 = in_stack_fffffffffffffcd8;
    if (*(ulong *)(in_RDI + 0x9c0) < 2) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                         (size_t)in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58);
      loc_00.super_LineCol.line = (size_t)in_stack_fffffffffffffcc8;
      loc_00.super_LineCol.offset = (size_t)in_stack_fffffffffffffcc0;
      loc_00.super_LineCol.col = (size_t)in_stack_fffffffffffffcd0;
      loc_00.name.str = (char *)in_stack_fffffffffffffcd8;
      loc_00.name.len = in_stack_fffffffffffffce0;
      error<25ul>((char (*) [25])in_stack_fffffffffffffcb0,loc_00);
      in_stack_fffffffffffffc58 = local_f0;
      in_stack_fffffffffffffc60 = pPStack_e8;
      in_stack_fffffffffffffc68 = local_e0;
      in_stack_fffffffffffffc70 = pLStack_d8;
      in_stack_fffffffffffffc78 = local_d0;
    }
    sVar5 = *(size_t *)
             (*(long *)(in_stack_fffffffffffffcd8 + 0x980) +
              ((*(long *)(in_stack_fffffffffffffcd8 + 0x988) + -1) - local_c8) * 0x98 + 0x10);
  }
  sVar7 = sVar5;
  if (sVar5 == 0xffffffffffffffff) {
    memcpy(local_1e8,"check failed: (parent_id != NONE)",0x22);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffcd0 = *(code **)(in_RDI + 0x9e8);
    in_stack_fffffffffffffcc8 = local_1e8;
    Location::Location(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                       (size_t)in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68,
                       (size_t)in_stack_fffffffffffffc60);
    in_stack_fffffffffffffc68 = (char *)CONCAT44(uStack_1fc,local_200);
    in_stack_fffffffffffffc70 = (Location *)CONCAT44(uStack_1f4,uStack_1f8);
    in_stack_fffffffffffffc58 = (State *)CONCAT44(uStack_20c,local_210);
    in_stack_fffffffffffffc60 = (Parser *)CONCAT44(uStack_204,uStack_208);
    (*in_stack_fffffffffffffcd0)(in_stack_fffffffffffffcc8,0x22,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffc78 = local_1f0;
  }
  bVar2 = Tree::is_root(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
  if (!bVar2) {
    memcpy(local_248,"check failed: (m_tree->is_root(parent_id))",0x2b);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffcc0 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                       (size_t)in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68,
                       (size_t)in_stack_fffffffffffffc60);
    in_stack_fffffffffffffc68 = (char *)CONCAT44(uStack_25c,local_260);
    in_stack_fffffffffffffc70 = (Location *)CONCAT44(uStack_254,uStack_258);
    in_stack_fffffffffffffc58 = (State *)CONCAT44(uStack_26c,local_270);
    in_stack_fffffffffffffc60 = (Parser *)CONCAT44(uStack_264,uStack_268);
    (*in_stack_fffffffffffffcc0)(local_248,0x2b,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffc78 = local_250;
  }
  pNVar4 = Parser::node(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  if (pNVar4 != (NodeData *)0x0) {
    in_stack_fffffffffffffcb0 =
         (Tree *)Parser::node(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    pTVar6 = (Tree *)Parser::node(in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58);
    if (in_stack_fffffffffffffcb0 != pTVar6) {
      memcpy(local_2c8,
             "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))",0x4d);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      in_stack_fffffffffffffca8 = *(code **)(in_RDI + 0x9e8);
      Location::Location(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                         (size_t)in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68,
                         (size_t)in_stack_fffffffffffffc60);
      in_stack_fffffffffffffc68 = (char *)CONCAT44(uStack_2dc,local_2e0);
      in_stack_fffffffffffffc70 = (Location *)CONCAT44(uStack_2d4,uStack_2d8);
      in_stack_fffffffffffffc58 = (State *)CONCAT44(uStack_2ec,local_2f0);
      in_stack_fffffffffffffc60 = (Parser *)CONCAT44(uStack_2e4,uStack_2e8);
      (*in_stack_fffffffffffffca8)(local_2c8,0x4d,*(undefined8 *)(in_RDI + 0x9d0));
    }
  }
  if ((local_149 & 1) != 0) {
    local_138 = *(undefined8 *)(in_RDI + 0x30);
    local_140 = sVar5;
    local_b8 = Tree::_p(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
    if (((local_b8->m_type).type & STREAM) != STREAM) {
      Tree::set_root_as_stream(in_stack_fffffffffffffd48);
    }
    uVar1 = *(undefined8 *)(in_RDI + 0x30);
    local_130 = sVar5;
    local_128 = uVar1;
    pNVar4 = Tree::_p(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
    local_30 = pNVar4->m_last_child;
    local_28 = sVar5;
    local_20 = uVar1;
    if (sVar5 == 0xffffffffffffffff) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                         (size_t)in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58);
      loc_01.super_LineCol.line = (size_t)in_stack_fffffffffffffcc8;
      loc_01.super_LineCol.offset = (size_t)in_stack_fffffffffffffcc0;
      loc_01.super_LineCol.col = (size_t)in_stack_fffffffffffffcd0;
      loc_01.name.str = (char *)in_stack_fffffffffffffcd8;
      loc_01.name.len = sVar7;
      error<29ul>((char (*) [29])in_stack_fffffffffffffcb0,loc_01);
      in_stack_fffffffffffffc58 = local_58;
      in_stack_fffffffffffffc60 = pPStack_50;
      in_stack_fffffffffffffc68 = local_48;
      in_stack_fffffffffffffc70 = pLStack_40;
    }
    local_18 = local_28;
    local_10 = uVar1;
    local_8 = Tree::_p(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
    if ((((local_8->m_type).type & (STREAM|MAP)) == NOTYPE) &&
       (bVar2 = Tree::is_root(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8), !bVar2))
    {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                         (size_t)in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58);
      loc_02.super_LineCol.line = (size_t)in_stack_fffffffffffffcc8;
      loc_02.super_LineCol.offset = (size_t)in_stack_fffffffffffffcc0;
      loc_02.super_LineCol.col = (size_t)in_stack_fffffffffffffcd0;
      loc_02.name.str = (char *)in_stack_fffffffffffffcd8;
      loc_02.name.len = sVar7;
      error<54ul>((char (*) [54])in_stack_fffffffffffffcb0,loc_02);
      in_stack_fffffffffffffc58 = local_80;
      in_stack_fffffffffffffc60 = pPStack_78;
      in_stack_fffffffffffffc68 = local_70;
      in_stack_fffffffffffffc70 = pLStack_68;
    }
    if ((local_30 != 0xffffffffffffffff) &&
       (pNVar4 = Tree::_p(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8),
       pNVar4->m_parent != local_28)) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                         (size_t)in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58);
      loc_03.super_LineCol.line = (size_t)in_stack_fffffffffffffcc8;
      loc_03.super_LineCol.offset = (size_t)in_stack_fffffffffffffcc0;
      loc_03.super_LineCol.col = (size_t)in_stack_fffffffffffffcd0;
      loc_03.name.str = (char *)in_stack_fffffffffffffcd8;
      loc_03.name.len = sVar7;
      error<63ul>((char (*) [63])in_stack_fffffffffffffcb0,loc_03);
      in_stack_fffffffffffffc58 = local_a8;
      in_stack_fffffffffffffc60 = pPStack_a0;
    }
    local_b0 = Tree::_claim(in_stack_fffffffffffffe30);
    Tree::_set_hierarchy(in_stack_00000130,stack0x00000128,msg_3._64_8_,msg_3._56_8_);
    *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x10) = local_b0;
    Tree::to_doc(this_00,(size_t)node,(type_bits)in_stack_fffffffffffffcf0);
  }
  on = (flag_t)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  add_flags(in_stack_fffffffffffffc60,on);
  _handle_types((Parser *)child);
  rem_flags(in_stack_fffffffffffffc60,on);
  return;
}

Assistant:

void Parser::_start_doc(bool as_child)
{
    _c4dbgpf("start_doc (as child={})", as_child);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_root(parent_id));
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        _c4dbgpf("start_doc: parent={}", parent_id);
        if( ! m_tree->is_stream(parent_id))
        {
            _c4dbgp("start_doc: rearranging with root as STREAM");
            m_tree->set_root_as_stream();
        }
        m_state->node_id = m_tree->append_child(parent_id);
        m_tree->to_doc(m_state->node_id);
    }
    #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_seq(parent_id) || m_tree->empty(parent_id));
        m_state->node_id = parent_id;
        if( ! m_tree->is_doc(parent_id))
        {
            m_tree->to_doc(parent_id, DOC);
        }
    }
    #endif
    _c4dbgpf("start_doc: id={}", m_state->node_id);
    add_flags(RUNK|RTOP|NDOC);
    _handle_types();
    rem_flags(NDOC);
}